

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::added2Set
          (SPxLPBase<double> *this,SVSetBase<double> *set,SVSetBase<double> *addset,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  SVectorBase<double> *pSVar5;
  char *pcVar6;
  SVectorBase<double> *this_00;
  int *piVar7;
  double *pdVar8;
  int in_ECX;
  int __c;
  ulong extraout_RDX;
  ulong uVar9;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  undefined8 extraout_RDX_01;
  SVectorBase<double> *l_xtend;
  int m;
  int k;
  int j_2;
  SVectorBase<double> *vec_1;
  int i_3;
  int j_1;
  int i_2;
  int j;
  SVectorBase<double> *vec;
  int i_1;
  int end;
  int tot;
  int i;
  int *more;
  DataArray<int> moreArray;
  _func_int **in_stack_fffffffffffffed8;
  SVSetBase<double> *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  DataArray<int> *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SVectorBase<double> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint n_00;
  uint local_84;
  int local_78;
  int local_70;
  uint local_6c;
  int local_60;
  int local_58;
  int local_44;
  DataArray<int> local_38;
  int local_1c;
  
  if (in_ECX != 0) {
    local_1c = in_ECX;
    SVSetBase<double>::num((SVSetBase<double> *)0x26f622);
    DataArray<int>::DataArray
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
               (Real)in_stack_fffffffffffffee0);
    piVar4 = DataArray<int>::get_ptr(&local_38);
    iVar1 = SVSetBase<double>::num((SVSetBase<double> *)0x26f665);
    local_44 = iVar1;
    while (local_44 = local_44 + -1, -1 < local_44) {
      piVar4[local_44] = 0;
    }
    local_58 = 0;
    iVar2 = SVSetBase<double>::num((SVSetBase<double> *)0x26f6f1);
    local_60 = SVSetBase<double>::num((SVSetBase<double> *)0x26f70f);
    for (local_60 = local_60 - local_1c; local_60 < iVar2; local_60 = local_60 + 1) {
      pSVar5 = SVSetBase<double>::operator[]
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20))
      ;
      iVar3 = SVectorBase<double>::size(pSVar5);
      local_58 = iVar3 + local_58;
      local_6c = SVectorBase<double>::size(pSVar5);
      uVar9 = extraout_RDX;
      while (local_6c = local_6c - 1, -1 < (int)local_6c) {
        pcVar6 = SVectorBase<double>::index(pSVar5,(char *)(ulong)local_6c,(int)uVar9);
        uVar9 = (ulong)(piVar4[(int)pcVar6] + 1U);
        piVar4[(int)pcVar6] = piVar4[(int)pcVar6] + 1U;
      }
    }
    iVar2 = SVSetBase<double>::memMax((SVSetBase<double> *)0x26f80b);
    if (iVar2 < local_58) {
      SVSetBase<double>::memRemax
                ((SVSetBase<double> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
    local_70 = SVSetBase<double>::num((SVSetBase<double> *)0x26f839);
    while (local_70 = local_70 + -1, -1 < local_70) {
      pSVar5 = SVSetBase<double>::operator[]
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20))
      ;
      iVar2 = SVectorBase<double>::size(pSVar5);
      SVSetBase<double>::operator[]
                (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      SVSetBase<double>::xtend
                ((SVSetBase<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,iVar1);
      pSVar5 = SVSetBase<double>::operator[]
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20))
      ;
      SVectorBase<double>::set_size(pSVar5,iVar2 + piVar4[local_70]);
      piVar4[local_70] = iVar2;
    }
    local_78 = SVSetBase<double>::num((SVSetBase<double> *)0x26f950);
    local_78 = local_78 - local_1c;
    while (iVar1 = local_78, iVar2 = SVSetBase<double>::num((SVSetBase<double> *)0x26f980),
          iVar1 < iVar2) {
      pSVar5 = SVSetBase<double>::operator[]
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20))
      ;
      local_84 = SVectorBase<double>::size(pSVar5);
      uVar10 = extraout_RDX_00;
      while( true ) {
        iVar1 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        local_84 = local_84 - 1;
        if ((int)local_84 < 0) break;
        pcVar6 = SVectorBase<double>::index(pSVar5,(char *)(ulong)local_84,(int)uVar10);
        n_00 = piVar4[(int)pcVar6];
        piVar4[(int)pcVar6] = n_00 + 1;
        this_00 = SVSetBase<double>::operator[](in_stack_fffffffffffffee0,iVar1);
        iVar1 = local_78;
        piVar7 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)n_00,__c);
        *piVar7 = iVar1;
        pdVar8 = SVectorBase<double>::value(pSVar5,local_84);
        in_stack_fffffffffffffed8 = (_func_int **)*pdVar8;
        in_stack_fffffffffffffee0 = (SVSetBase<double> *)SVectorBase<double>::value(this_00,n_00);
        (in_stack_fffffffffffffee0->super_ClassArray<soplex::Nonzero<double>_>)._vptr_ClassArray =
             in_stack_fffffffffffffed8;
        uVar10 = extraout_RDX_01;
      }
      local_78 = local_78 + 1;
    }
    DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }